

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ostream.h
# Opt level: O2

appender __thiscall
fmt::v8::detail::fallback_formatter<my_type,_char,_void>::format<fmt::v8::appender>
          (fallback_formatter<my_type,_char,_void> *this,my_type *value,
          basic_format_context<fmt::v8::appender,_char> *ctx)

{
  arg_ref<char> ref;
  formatter<fmt::v8::basic_string_view<char>,_char,_void> *pfVar1;
  char *out;
  size_t sVar2;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> bVar3;
  locale_ref in_R9;
  basic_string_view<char> s;
  basic_string_view<char> s_00;
  dynamic_format_specs<char> specs;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> buffer;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  char *pcStack_260;
  size_t local_258;
  undefined8 uStack_250;
  char *local_248;
  size_t sStack_240;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> local_238;
  
  local_238.super_buffer<char>.ptr_ = local_238.store_;
  local_238.super_buffer<char>.size_ = 0;
  local_238.super_buffer<char>._vptr_buffer = (_func_int **)&PTR_grow_0015c4c0;
  local_238.super_buffer<char>.capacity_ = 500;
  format_value<char,my_type>(&local_238.super_buffer<char>,value,(locale_ref)(ctx->loc_).locale_);
  sVar2 = local_238.super_buffer<char>.size_;
  out = local_238.super_buffer<char>.ptr_;
  if ((this->super_formatter<fmt::v8::basic_string_view<char>,_char,_void>).specs_.precision_ref.
      kind == none &&
      (this->super_formatter<fmt::v8::basic_string_view<char>,_char,_void>).specs_.width_ref.kind ==
      none) {
    s.size_ = (size_t)this;
    s.data_ = (char *)local_238.super_buffer<char>.size_;
    bVar3.container =
         (buffer<char> *)
         write<char,fmt::v8::appender>
                   ((ctx->out_).super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container
                    ,(appender)local_238.super_buffer<char>.ptr_,s,
                    (basic_format_specs<char> *)(ctx->loc_).locale_,in_R9);
  }
  else {
    local_278._0_4_ =
         (this->super_formatter<fmt::v8::basic_string_view<char>,_char,_void>).specs_.
         super_basic_format_specs<char>.width;
    local_278._4_4_ =
         (this->super_formatter<fmt::v8::basic_string_view<char>,_char,_void>).specs_.
         super_basic_format_specs<char>.precision;
    pfVar1 = &this->super_formatter<fmt::v8::basic_string_view<char>,_char,_void>;
    uStack_270._0_1_ =
         (this->super_formatter<fmt::v8::basic_string_view<char>,_char,_void>).specs_.
         super_basic_format_specs<char>.type;
    uStack_270._1_2_ =
         *(undefined2 *)
          &(this->super_formatter<fmt::v8::basic_string_view<char>,_char,_void>).specs_.
           super_basic_format_specs<char>.field_0x9;
    uStack_270._3_1_ = (pfVar1->specs_).super_basic_format_specs<char>.fill.data_[0];
    uStack_270._4_1_ = (pfVar1->specs_).super_basic_format_specs<char>.fill.data_[1];
    uStack_270._5_1_ = (pfVar1->specs_).super_basic_format_specs<char>.fill.data_[2];
    uStack_270._6_1_ = (pfVar1->specs_).super_basic_format_specs<char>.fill.data_[3];
    uStack_270._7_1_ = (pfVar1->specs_).super_basic_format_specs<char>.fill.size_;
    local_268 = *(undefined8 *)
                 &(this->super_formatter<fmt::v8::basic_string_view<char>,_char,_void>).specs_.
                  width_ref;
    pcStack_260 = (this->super_formatter<fmt::v8::basic_string_view<char>,_char,_void>).specs_.
                  width_ref.val.name.data_;
    local_258 = (this->super_formatter<fmt::v8::basic_string_view<char>,_char,_void>).specs_.
                width_ref.val.name.size_;
    uStack_250 = *(undefined8 *)
                  &(this->super_formatter<fmt::v8::basic_string_view<char>,_char,_void>).specs_.
                   precision_ref;
    local_248 = (this->super_formatter<fmt::v8::basic_string_view<char>,_char,_void>).specs_.
                precision_ref.val.name.data_;
    sStack_240 = (this->super_formatter<fmt::v8::basic_string_view<char>,_char,_void>).specs_.
                 precision_ref.val.name.size_;
    handle_dynamic_spec<fmt::v8::detail::width_checker,fmt::v8::basic_format_context<fmt::v8::appender,char>>
              ((int *)&local_278,
               (this->super_formatter<fmt::v8::basic_string_view<char>,_char,_void>).specs_.
               width_ref,ctx);
    ref.val.name.data_ = local_248;
    ref._0_8_ = uStack_250;
    ref.val.name.size_ = sStack_240;
    handle_dynamic_spec<fmt::v8::detail::precision_checker,fmt::v8::basic_format_context<fmt::v8::appender,char>>
              ((int *)((long)&local_278 + 4),ref,ctx);
    s_00.size_ = (size_t)&local_278;
    s_00.data_ = (char *)sVar2;
    bVar3.container =
         (buffer<char> *)
         write<char,fmt::v8::appender>
                   ((ctx->out_).super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container
                    ,(appender)out,s_00,(basic_format_specs<char> *)(ctx->loc_).locale_,in_R9);
  }
  basic_memory_buffer<char,_500UL,_std::allocator<char>_>::deallocate(&local_238);
  return (appender)(back_insert_iterator<fmt::v8::detail::buffer<char>_>)bVar3.container;
}

Assistant:

auto format(const T& value, basic_format_context<OutputIt, Char>& ctx)
      -> OutputIt {
    basic_memory_buffer<Char> buffer;
    format_value(buffer, value, ctx.locale());
    basic_string_view<Char> str(buffer.data(), buffer.size());
    return formatter<basic_string_view<Char>, Char>::format(str, ctx);
  }